

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O0

int __thiscall
FFlatVertexBuffer::CreateVertices
          (FFlatVertexBuffer *this,int h,sector_t *sec,secplane_t *plane,int floor)

{
  extsector_t *this_00;
  sector_t *psVar1;
  int iVar2;
  uint uVar3;
  sector_t **ppsVar4;
  TArray<sector_t_*,_sector_t_*> *this_01;
  F3DFloor *pFVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  bool dobottom;
  bool dotop;
  F3DFloor *ffloor;
  sector_t *fsec_1;
  uint g_1;
  TArray<sector_t_*,_sector_t_*> *xf;
  sector_t *fsec;
  uint g;
  TArray<sector_t_*,_sector_t_*> *fakes;
  int floor_local;
  secplane_t *plane_local;
  sector_t *sec_local;
  int h_local;
  FFlatVertexBuffer *this_local;
  
  dVar8 = sector_t::GetPlaneTexZ(sec,h);
  sec->vboheight[h] = dVar8;
  iVar2 = CreateSectorVertices(this,sec,plane,floor);
  sec->vboindex[h] = iVar2;
  this_00 = sec->e;
  for (fsec._4_4_ = 0;
      uVar3 = TArray<sector_t_*,_sector_t_*>::Size((TArray<sector_t_*,_sector_t_*> *)this_00),
      fsec._4_4_ < uVar3; fsec._4_4_ = fsec._4_4_ + 1) {
    ppsVar4 = TArray<sector_t_*,_sector_t_*>::operator[]
                        ((TArray<sector_t_*,_sector_t_*> *)this_00,(ulong)fsec._4_4_);
    psVar1 = *ppsVar4;
    iVar2 = CreateSectorVertices(this,psVar1,plane,0);
    psVar1->vboindex[h + 2] = iVar2;
  }
  this_01 = &(sec->e->XFloor).attached;
  for (fsec_1._4_4_ = 0; uVar3 = TArray<sector_t_*,_sector_t_*>::Size(this_01), fsec_1._4_4_ < uVar3
      ; fsec_1._4_4_ = fsec_1._4_4_ + 1) {
    ppsVar4 = TArray<sector_t_*,_sector_t_*>::operator[](this_01,(ulong)fsec_1._4_4_);
    psVar1 = *ppsVar4;
    pFVar5 = Find3DFloor(psVar1,sec);
    if ((pFVar5 != (F3DFloor *)0x0) && ((pFVar5->flags & 8) != 0)) {
      bVar6 = false;
      if ((pFVar5->top).model == sec) {
        bVar6 = (pFVar5->top).isceiling == h;
      }
      bVar7 = false;
      if ((pFVar5->bottom).model == sec) {
        bVar7 = (pFVar5->bottom).isceiling == h;
      }
      if ((bVar6) || (bVar7)) {
        if (bVar6) {
          uVar3 = TArray<FFlatVertex,_FFlatVertex>::Size(&this->vbo_shadowdata);
          (pFVar5->top).vindex = uVar3;
        }
        if (bVar7) {
          uVar3 = TArray<FFlatVertex,_FFlatVertex>::Size(&this->vbo_shadowdata);
          (pFVar5->bottom).vindex = uVar3;
        }
        CreateSectorVertices(this,psVar1,plane,0);
      }
    }
  }
  uVar3 = TArray<FFlatVertex,_FFlatVertex>::Size(&this->vbo_shadowdata);
  sec->vbocount[h] = uVar3 - sec->vboindex[h];
  return sec->vboindex[h];
}

Assistant:

int FFlatVertexBuffer::CreateVertices(int h, sector_t *sec, const secplane_t &plane, int floor)
{
	// First calculate the vertices for the sector itself
	sec->vboheight[h] = sec->GetPlaneTexZ(h);
	sec->vboindex[h] = CreateSectorVertices(sec, plane, floor);

	// Next are all sectors using this one as heightsec
	TArray<sector_t *> &fakes = sec->e->FakeFloor.Sectors;
	for (unsigned g=0; g<fakes.Size(); g++)
	{
		sector_t *fsec = fakes[g];
		fsec->vboindex[2+h] = CreateSectorVertices(fsec, plane, false);
	}

	// and finally all attached 3D floors
	TArray<sector_t *> &xf = sec->e->XFloor.attached;
	for (unsigned g=0; g<xf.Size(); g++)
	{
		sector_t *fsec = xf[g];
		F3DFloor *ffloor = Find3DFloor(fsec, sec);

		if (ffloor != NULL && ffloor->flags & FF_RENDERPLANES)
		{
			bool dotop = (ffloor->top.model == sec) && (ffloor->top.isceiling == h);
			bool dobottom = (ffloor->bottom.model == sec) && (ffloor->bottom.isceiling == h);

			if (dotop || dobottom)
			{
				if (dotop) ffloor->top.vindex = vbo_shadowdata.Size();
				if (dobottom) ffloor->bottom.vindex = vbo_shadowdata.Size();
	
				CreateSectorVertices(fsec, plane, false);
			}
		}
	}
	sec->vbocount[h] = vbo_shadowdata.Size() - sec->vboindex[h];
	return sec->vboindex[h];
}